

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_sstream.c
# Opt level: O0

double HTS_set_specified_duration
                 (size_t *duration,double *mean,double *vari,size_t size,double frame_length)

{
  undefined8 uVar1;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  size_t target_length;
  size_t sum;
  double rho;
  double temp2;
  double temp1;
  int j;
  size_t i;
  ulong local_68;
  ulong local_60;
  double local_50;
  double local_48;
  int local_3c;
  ulong local_38;
  double local_8;
  undefined4 uVar6;
  
  local_60 = 0;
  if (1.0 <= in_XMM0_Qa + 0.5) {
    local_68 = (ulong)(in_XMM0_Qa + 0.5);
    local_68 = local_68 |
               (long)((in_XMM0_Qa + 0.5) - 9.223372036854776e+18) & (long)local_68 >> 0x3f;
  }
  else {
    local_68 = 1;
  }
  if (in_RCX < local_68) {
    local_48 = 0.0;
    local_50 = 0.0;
    for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
      local_48 = *(double *)(in_RSI + local_38 * 8) + local_48;
      local_50 = *(double *)(in_RDX + local_38 * 8) + local_50;
    }
    uVar6 = (undefined4)(local_68 >> 0x20);
    auVar4._8_4_ = uVar6;
    auVar4._0_8_ = local_68;
    auVar4._12_4_ = 0x45300000;
    local_50 = (((auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0)) - local_48) /
               local_50;
    for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
      local_48 = local_50 * *(double *)(in_RDX + local_38 * 8) + *(double *)(in_RSI + local_38 * 8)
                 + 0.5;
      if (1.0 <= local_48) {
        *(long *)(in_RDI + local_38 * 8) =
             (long)local_48 | (long)(local_48 - 9.223372036854776e+18) & (long)local_48 >> 0x3f;
      }
      else {
        *(undefined8 *)(in_RDI + local_38 * 8) = 1;
      }
      local_60 = *(long *)(in_RDI + local_38 * 8) + local_60;
    }
    while (local_68 != local_60) {
      if (local_60 < local_68) {
        local_3c = -1;
        for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
          uVar1 = *(undefined8 *)(in_RDI + local_38 * 8);
          auVar7._8_4_ = (int)((ulong)uVar1 >> 0x20);
          auVar7._0_8_ = uVar1;
          auVar7._12_4_ = 0x45300000;
          dVar2 = (double)((ulong)(local_50 -
                                  (((auVar7._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) +
                                   1.0) - *(double *)(in_RSI + local_38 * 8)) /
                                  *(double *)(in_RDX + local_38 * 8)) & (ulong)DAT_00226630);
          if ((local_3c < 0) || (dVar2 < local_48)) {
            local_3c = (int)local_38;
            local_48 = dVar2;
          }
        }
        local_60 = local_60 + 1;
        *(long *)(in_RDI + (long)local_3c * 8) = *(long *)(in_RDI + (long)local_3c * 8) + 1;
      }
      else {
        local_3c = -1;
        for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
          if (1 < *(ulong *)(in_RDI + local_38 * 8)) {
            uVar1 = *(undefined8 *)(in_RDI + local_38 * 8);
            auVar8._8_4_ = (int)((ulong)uVar1 >> 0x20);
            auVar8._0_8_ = uVar1;
            auVar8._12_4_ = 0x45300000;
            dVar2 = (double)((ulong)(local_50 -
                                    ((((auVar8._8_8_ - 1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)
                                      ) - 1.0) - *(double *)(in_RSI + local_38 * 8)) /
                                    *(double *)(in_RDX + local_38 * 8)) & (ulong)DAT_00226630);
            if ((local_3c < 0) || (dVar2 < local_48)) {
              local_3c = (int)local_38;
              local_48 = dVar2;
            }
          }
        }
        local_60 = local_60 - 1;
        *(long *)(in_RDI + (long)local_3c * 8) = *(long *)(in_RDI + (long)local_3c * 8) + -1;
      }
    }
    auVar5._8_4_ = uVar6;
    auVar5._0_8_ = local_68;
    auVar5._12_4_ = 0x45300000;
    local_8 = (auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0);
  }
  else {
    if (local_68 < in_RCX) {
      HTS_error(-1,"HTS_set_specified_duration: Specified frame length is too short.\n");
    }
    for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
      *(undefined8 *)(in_RDI + local_38 * 8) = 1;
    }
    auVar3._8_4_ = (int)(in_RCX >> 0x20);
    auVar3._0_8_ = in_RCX;
    auVar3._12_4_ = 0x45300000;
    local_8 = (auVar3._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)in_RCX) - 4503599627370496.0);
  }
  return local_8;
}

Assistant:

static double HTS_set_specified_duration(size_t * duration, double *mean, double *vari, size_t size, double frame_length)
{
   size_t i;
   int j;
   double temp1, temp2;
   double rho = 0.0;
   size_t sum = 0;
   size_t target_length;

   /* get the target frame length */
   if (frame_length + 0.5 < 1.0)
      target_length = 1;
   else
      target_length = (size_t) (frame_length + 0.5);

   /* check the specified duration */
   if (target_length <= size) {
      if (target_length < size)
         HTS_error(-1, "HTS_set_specified_duration: Specified frame length is too short.\n");
      for (i = 0; i < size; i++)
         duration[i] = 1;
      return (double) size;
   }

   /* RHO calculation */
   temp1 = 0.0;
   temp2 = 0.0;
   for (i = 0; i < size; i++) {
      temp1 += mean[i];
      temp2 += vari[i];
   }
   rho = ((double) target_length - temp1) / temp2;

   /* first estimation */
   for (i = 0; i < size; i++) {
      temp1 = mean[i] + rho * vari[i] + 0.5;
      if (temp1 < 1.0)
         duration[i] = 1;
      else
         duration[i] = (size_t) temp1;
      sum += duration[i];
   }

   /* loop estimation */
   while (target_length != sum) {
      /* sarch flexible state and modify its duration */
      if (target_length > sum) {
         j = -1;
         for (i = 0; i < size; i++) {
            temp2 = fabs(rho - ((double) duration[i] + 1 - mean[i]) / vari[i]);
            if (j < 0 || temp1 > temp2) {
               j = i;
               temp1 = temp2;
            }
         }
         sum++;
         duration[j]++;
      } else {
         j = -1;
         for (i = 0; i < size; i++) {
            if (duration[i] > 1) {
               temp2 = fabs(rho - ((double) duration[i] - 1 - mean[i]) / vari[i]);
               if (j < 0 || temp1 > temp2) {
                  j = i;
                  temp1 = temp2;
               }
            }
         }
         sum--;
         duration[j]--;
      }
   }

   return (double) target_length;
}